

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O2

void __thiscall
ContractTestOnClassWithInvariant_ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange_Test
::
~ContractTestOnClassWithInvariant_ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange_Test
          (ContractTestOnClassWithInvariant_ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange_Test
           *this)

{
  ContractTestOnClassWithInvariant::~ContractTestOnClassWithInvariant
            (&this->super_ContractTestOnClassWithInvariant);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange)
{
  auto oldX = sut.x;
  auto oldY = sut.y;
  EXPECT_THROW(sut.setX(0), PreConditionFailedEx);

  EXPECT_EQ(0, sut.invariantWasCalled);
  EXPECT_TRUE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);

  EXPECT_EQ(oldX, sut.x);
  EXPECT_EQ(oldY, sut.y);
}